

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool __thiscall
cmCMakePresetsGraphInternal::AnyAllOfCondition::Evaluate
          (AnyAllOfCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  pointer puVar1;
  Condition *pCVar2;
  char cVar3;
  byte bVar5;
  pointer puVar6;
  optional<bool> result;
  _Storage<bool,_true> local_3a;
  bool bStack_39;
  _Optional_payload_base<bool> *local_38;
  int iVar4;
  
  puVar6 = (this->Conditions).
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Conditions).
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (_Optional_payload_base<bool> *)out;
  if (puVar6 == puVar1) {
    bVar5 = this->StopValue;
  }
  else {
    do {
      _local_3a = (_Optional_payload_base<bool>)((ushort)_local_3a & 0xff);
      pCVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
      iVar4 = (*pCVar2->_vptr_Condition[2])(pCVar2,expanders,(ulong)(uint)version,&local_3a);
      cVar3 = (char)iVar4;
      if ((cVar3 == '\0') || (bStack_39 == false)) {
        if (local_38->_M_engaged != true) {
          return (bool)cVar3;
        }
        local_38->_M_engaged = false;
        return (bool)cVar3;
      }
      bVar5 = this->StopValue;
      if (local_3a._M_value == (bool)bVar5) {
        *local_38 = _local_3a;
        return (bool)cVar3;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  *local_38 = (_Optional_payload_base<bool>)(bVar5 ^ 1 | 0x100);
  return true;
}

Assistant:

bool cmCMakePresetsGraphInternal::AnyAllOfCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  for (auto const& condition : this->Conditions) {
    cm::optional<bool> result;
    if (!condition->Evaluate(expanders, version, result)) {
      out.reset();
      return false;
    }

    if (!result) {
      out.reset();
      return true;
    }

    if (result == this->StopValue) {
      out = result;
      return true;
    }
  }

  out = !this->StopValue;
  return true;
}